

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sun.cpp
# Opt level: O3

ON__UINT32 __thiscall ON_Sun::DataCRC(ON_Sun *this,ON__UINT32 crc)

{
  bool bVar1;
  ON__UINT32 OVar2;
  int iVar3;
  double dVar4;
  int d;
  int m;
  int y;
  double h;
  ON__INT64 local_50;
  int local_44;
  int local_40;
  int local_3c;
  double local_38;
  
  bVar1 = CImpl::EnableAllowed(this->_impl);
  local_50._0_1_ = bVar1;
  OVar2 = ON_CRC32(crc,1,&local_50);
  local_50._0_1_ = CImpl::EnableOn(this->_impl);
  OVar2 = ON_CRC32(OVar2,1,&local_50);
  local_50._0_1_ = CImpl::ManualControlAllowed(this->_impl);
  OVar2 = ON_CRC32(OVar2,1,&local_50);
  local_50._0_1_ = CImpl::ManualControlOn(this->_impl);
  OVar2 = ON_CRC32(OVar2,1,&local_50);
  bVar1 = CImpl::DaylightSavingOn(this->_impl);
  local_50 = CONCAT71(local_50._1_7_,bVar1);
  OVar2 = ON_CRC32(OVar2,1,&local_50);
  iVar3 = CImpl::DaylightSavingMinutes(this->_impl);
  local_50 = CONCAT44(local_50._4_4_,iVar3);
  OVar2 = ON_CRC32(OVar2,4,&local_50);
  dVar4 = CImpl::Azimuth(this->_impl);
  local_50 = Integerize(dVar4);
  OVar2 = ON_CRC32(OVar2,8,&local_50);
  dVar4 = CImpl::Altitude(this->_impl);
  local_50 = Integerize(dVar4);
  OVar2 = ON_CRC32(OVar2,8,&local_50);
  dVar4 = CImpl::North(this->_impl);
  local_50 = Integerize(dVar4);
  OVar2 = ON_CRC32(OVar2,8,&local_50);
  dVar4 = CImpl::Latitude(this->_impl);
  local_50 = Integerize(dVar4);
  OVar2 = ON_CRC32(OVar2,8,&local_50);
  dVar4 = CImpl::Longitude(this->_impl);
  local_50 = Integerize(dVar4);
  OVar2 = ON_CRC32(OVar2,8,&local_50);
  dVar4 = CImpl::TimeZone(this->_impl);
  local_50 = Integerize(dVar4);
  OVar2 = ON_CRC32(OVar2,8,&local_50);
  dVar4 = CImpl::ShadowIntensity(this->_impl);
  local_50 = Integerize(dVar4);
  OVar2 = ON_CRC32(OVar2,8,&local_50);
  dVar4 = CImpl::Intensity(this->_impl);
  local_50 = Integerize(dVar4);
  OVar2 = ON_CRC32(OVar2,8,&local_50);
  local_3c = 0;
  local_40 = 0;
  local_44 = 0;
  local_38 = 0.0;
  CImpl::LocalDateTime(this->_impl,&local_3c,&local_40,&local_44,&local_38);
  local_50._0_4_ = local_3c;
  OVar2 = ON_CRC32(OVar2,4,&local_50);
  local_50._0_4_ = local_40;
  OVar2 = ON_CRC32(OVar2,4,&local_50);
  local_50 = CONCAT44(local_50._4_4_,local_44);
  OVar2 = ON_CRC32(OVar2,4,&local_50);
  local_50 = Integerize(local_38);
  OVar2 = ON_CRC32(OVar2,8,&local_50);
  return OVar2;
}

Assistant:

ON__UINT32 ON_Sun::DataCRC(ON__UINT32 crc) const
{
  // We need to calculate the CRC of the underlying storage, so we can't allow virtual overrides to
  // execute because they might hide the real values we want to use.

  crc = UpdateCRC(crc, ON_Sun::EnableAllowed());
  crc = UpdateCRC(crc, ON_Sun::EnableOn());
  crc = UpdateCRC(crc, ON_Sun::ManualControlAllowed());
  crc = UpdateCRC(crc, ON_Sun::ManualControlOn());
  crc = UpdateCRC(crc, ON_Sun::DaylightSavingOn());
  crc = UpdateCRC(crc, ON_Sun::DaylightSavingMinutes());
  crc = UpdateCRC(crc, Integerize(ON_Sun::Azimuth()));
  crc = UpdateCRC(crc, Integerize(ON_Sun::Altitude()));
  crc = UpdateCRC(crc, Integerize(ON_Sun::North()));
  crc = UpdateCRC(crc, Integerize(ON_Sun::Latitude()));
  crc = UpdateCRC(crc, Integerize(ON_Sun::Longitude()));
  crc = UpdateCRC(crc, Integerize(ON_Sun::TimeZone()));
  crc = UpdateCRC(crc, Integerize(ON_Sun::ShadowIntensity()));
  crc = UpdateCRC(crc, Integerize(ON_Sun::Intensity()));

  int y = 0, m = 0, d = 0; double h = 0.0;
  ON_Sun::LocalDateTime(y, m, d, h);
  crc = UpdateCRC(crc, y);
  crc = UpdateCRC(crc, m);
  crc = UpdateCRC(crc, d);
  crc = UpdateCRC(crc, Integerize(h));

  return crc;
}